

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

void installMethodsInClass
               (Class cls,SparseArray *methods_to_replace,SparseArray *methods,BOOL replaceExisting)

{
  BOOL BVar1;
  objc_method *method;
  objc_method *local_50;
  objc_method *method_to_replace;
  objc_method *m;
  dtable_t pSStack_30;
  uint32_t idx;
  SparseArray *dtable;
  SparseArray *pSStack_20;
  BOOL replaceExisting_local;
  SparseArray *methods_local;
  SparseArray *methods_to_replace_local;
  Class cls_local;
  
  dtable._7_1_ = replaceExisting;
  pSStack_20 = methods;
  methods_local = methods_to_replace;
  methods_to_replace_local = (SparseArray *)cls;
  pSStack_30 = dtable_for_class(cls);
  if (uninstalled_dtable == pSStack_30) {
    __assert_fail("uninstalled_dtable != dtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                  0x1a6,"void installMethodsInClass(Class, SparseArray *, SparseArray *, BOOL)");
  }
  m._4_4_ = 0;
  while (method = (objc_method *)SparseArrayNext(pSStack_20,(uint32_t *)((long)&m + 4)),
        method != (objc_method *)0x0) {
    if (methods_local == (SparseArray *)0x0) {
      local_50 = (objc_method *)0x0;
    }
    else {
      local_50 = (objc_method *)
                 SparseArrayLookup(methods_local,(uint32_t)(method->selector->field_0).index);
    }
    BVar1 = installMethodInDtable
                      ((Class)methods_to_replace_local,pSStack_30,method,local_50,dtable._7_1_);
    if (BVar1 == '\0') {
      SparseArrayInsert(pSStack_20,m._4_4_,(void *)0x0);
    }
  }
  return;
}

Assistant:

static void installMethodsInClass(Class cls,
                                  SparseArray *methods_to_replace,
                                  SparseArray *methods,
                                  BOOL replaceExisting)
{
	SparseArray *dtable = dtable_for_class(cls);
	assert(uninstalled_dtable != dtable);

	uint32_t idx = 0;
	struct objc_method *m;
	while ((m = SparseArrayNext(methods, &idx)))
	{
		struct objc_method *method_to_replace = methods_to_replace
			?  SparseArrayLookup(methods_to_replace, m->selector->index)
			: NULL;
		if (!installMethodInDtable(cls, dtable, m, method_to_replace, replaceExisting))
		{
			// Remove this method from the list, if it wasn't actually installed
			SparseArrayInsert(methods, idx, 0);
		}
	}
}